

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModulusPoly.cpp
# Opt level: O2

ModulusPoly * __thiscall
ZXing::Pdf417::ModulusPoly::add
          (ModulusPoly *__return_storage_ptr__,ModulusPoly *this,ModulusPoly *other)

{
  pointer piVar1;
  ModulusGF *pMVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  bool bVar4;
  ulong uVar5;
  invalid_argument *this_00;
  int *piVar6;
  ModulusPoly *pMVar7;
  pointer piVar8;
  int iVar9;
  vector<int,_std::allocator<int>_> *pvVar10;
  size_t i;
  ulong uVar11;
  allocator_type local_41;
  vector<int,_std::allocator<int>_> sumDiff;
  
  if (this->_field == other->_field) {
    bVar4 = isZero(this);
    pMVar7 = other;
    if ((bVar4) || (bVar4 = isZero(other), pMVar7 = this, bVar4)) {
      ModulusPoly(__return_storage_ptr__,pMVar7);
    }
    else {
      piVar8 = (this->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar1 = (other->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pvVar10 = &other->_coefficients;
      pvVar3 = &this->_coefficients;
      if ((ulong)((long)(other->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_finish - (long)piVar1) <
          (ulong)((long)(this->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar8)) {
        pvVar10 = &this->_coefficients;
        pvVar3 = &other->_coefficients;
        piVar1 = piVar8;
      }
      std::vector<int,_std::allocator<int>_>::vector
                (&sumDiff,(long)(pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish - (long)piVar1 >> 2,&local_41);
      piVar8 = (pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = (long)(pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar8 >> 2;
      piVar6 = (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = uVar5 - ((long)(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar6 >> 2);
      if (uVar11 != 0) {
        memmove(sumDiff.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start,piVar8,uVar11 * 4);
        piVar8 = (pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = (long)(pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar8 >> 2;
      }
      pMVar2 = this->_field;
      for (; uVar11 < uVar5; uVar11 = uVar11 + 1) {
        iVar9 = pMVar2->_modulus;
        if (piVar8[uVar11] + *piVar6 < iVar9) {
          iVar9 = 0;
        }
        sumDiff.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar11] = (piVar8[uVar11] + *piVar6) - iVar9;
        piVar6 = piVar6 + 1;
      }
      ModulusPoly(__return_storage_ptr__,this->_field,&sumDiff);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&sumDiff.super__Vector_base<int,_std::allocator<int>_>);
    }
    return __return_storage_ptr__;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"ModulusPolys do not have same ModulusGF field");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

ModulusPoly
ModulusPoly::add(const ModulusPoly& other) const
{
	if (_field != other._field) {
		throw std::invalid_argument("ModulusPolys do not have same ModulusGF field");
	}
	if (isZero()) {
		return other;
	}
	if (other.isZero()) {
		return *this;
	}

	auto smallerCoefficients = &_coefficients;
	auto largerCoefficients = &other._coefficients;
	if (smallerCoefficients->size() > largerCoefficients->size()) {
		std::swap(smallerCoefficients, largerCoefficients);
	}
	std::vector<int> sumDiff(largerCoefficients->size());
	size_t lengthDiff = largerCoefficients->size() - smallerCoefficients->size();

	// Copy high-order terms only found in higher-degree polynomial's coefficients
	std::copy_n(largerCoefficients->begin(), lengthDiff, sumDiff.begin());
	for (size_t i = lengthDiff; i < largerCoefficients->size(); i++) {
		sumDiff[i] = _field->add((*smallerCoefficients)[i - lengthDiff], (*largerCoefficients)[i]);
	}
	return ModulusPoly(*_field, sumDiff);
}